

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Coefficients *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::Coefficients>::New
          (Arena *arena)

{
  Arena *arena_local;
  Coefficients *local_28;
  Coefficients *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (Coefficients *)operator_new(0x28);
    CoreML::Specification::Coefficients::Coefficients(local_28);
  }
  else {
    local_28 = (Coefficients *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::Coefficients::typeinfo,0x28);
    CoreML::Specification::Coefficients::Coefficients(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<CoreML::Specification::Coefficients>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }